

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  string *this;
  FILE *__stream;
  int iVar1;
  LogDestination *this_00;
  MutexLock local_40;
  MutexLock local_38;
  MutexLock l;
  
  if (3 < (uint)severity) {
    __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                  ,0x29b,
                  "static void google::LogDestination::SetLogDestination(LogSeverity, const char *)"
                 );
  }
  local_38.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) goto LAB_00128655;
  }
  this_00 = (LogDestination *)(&log_destinations_)[(uint)severity];
  if (this_00 == (LogDestination *)0x0) {
    this_00 = (LogDestination *)operator_new(0xe8);
    LogDestination(this_00,severity,(char *)0x0);
    (&log_destinations_)[(uint)severity] = this_00;
  }
  local_40.mu_ = &(this_00->fileobject_).lock_;
  if ((this_00->fileobject_).lock_.is_safe_ == true) {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_40.mu_);
    if (iVar1 != 0) {
LAB_00128655:
      abort();
    }
  }
  this = &(this_00->fileobject_).base_filename_;
  (this_00->fileobject_).base_filename_selected_ = true;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this,base_filename);
  if (iVar1 != 0) {
    __stream = (FILE *)(this_00->fileobject_).file_;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      (this_00->fileobject_).file_ = (FILE *)0x0;
      (this_00->fileobject_).rollover_attempt_ = 0x1f;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,base_filename);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}